

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O0

node_type * __thiscall
Tree<NULLC::Range>::erase(Tree<NULLC::Range> *this,node_type *node,Range *key)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  node<NULLC::Range> *key_00;
  node_type *pnVar4;
  node<NULLC::Range> *local_50;
  int balance;
  node_type *temp_1;
  node_type *temp;
  Range *key_local;
  node_type *node_local;
  Tree<NULLC::Range> *this_local;
  
  this_local = (Tree<NULLC::Range> *)node;
  if (node != (node_type *)0x0) {
    bVar1 = NULLC::Range::operator<(key,&node->key);
    key_local = &node->key;
    if (bVar1) {
      pnVar4 = erase(this,node->left,key);
      node->left = pnVar4;
    }
    else {
      bVar1 = NULLC::Range::operator>(key,&node->key);
      if (bVar1) {
        pnVar4 = erase(this,node->right,key);
        node->right = pnVar4;
      }
      else if ((node->left == (node<NULLC::Range> *)0x0) ||
              (node->right == (node<NULLC::Range> *)0x0)) {
        if (node->left == (node<NULLC::Range> *)0x0) {
          local_50 = node->right;
        }
        else {
          local_50 = node->left;
        }
        temp_1 = local_50;
        if (local_50 == (node<NULLC::Range> *)0x0) {
          key_local = (Range *)0x0;
          temp_1 = node;
        }
        else {
          memcpy(node,local_50,0x24);
        }
        TypedObjectPool<detail::node<NULLC::Range>,_1024>::Deallocate(&this->pool,temp_1);
        if (temp_1 == this->root) {
          this->root = (node_type *)key_local;
        }
      }
      else {
        key_00 = detail::node<NULLC::Range>::min_tree(node->right);
        (node->key).start = (key_00->key).start;
        (node->key).end = (key_00->key).end;
        pnVar4 = erase(this,node->right,&key_00->key);
        node->right = pnVar4;
      }
    }
    if (key_local == (Range *)0x0) {
      this_local = (Tree<NULLC::Range> *)key_local;
    }
    else {
      iVar2 = get_height(this,(node_type *)key_local[1].start);
      iVar3 = get_height(this,(node_type *)key_local[1].end);
      iVar2 = detail::max<int>(iVar2,iVar3);
      *(int *)&key_local[2].start = iVar2 + 1;
      iVar2 = get_balance(this,(node_type *)key_local);
      if ((iVar2 < 2) || (iVar3 = get_balance(this,(node_type *)key_local[1].start), iVar3 < 0)) {
        if ((iVar2 < 2) || (iVar3 = get_balance(this,(node_type *)key_local[1].start), -1 < iVar3))
        {
          if ((iVar2 < -1) && (iVar3 = get_balance(this,(node_type *)key_local[1].end), iVar3 < 1))
          {
            this_local = (Tree<NULLC::Range> *)left_rotate(this,(node_type *)key_local);
          }
          else if ((iVar2 < -1) &&
                  (iVar2 = get_balance(this,(node_type *)key_local[1].end), 0 < iVar2)) {
            pnVar4 = right_rotate(this,(node_type *)key_local[1].end);
            key_local[1].end = pnVar4;
            this_local = (Tree<NULLC::Range> *)left_rotate(this,(node_type *)key_local);
          }
          else {
            this_local = (Tree<NULLC::Range> *)key_local;
          }
        }
        else {
          pnVar4 = left_rotate(this,(node_type *)key_local[1].start);
          key_local[1].start = pnVar4;
          this_local = (Tree<NULLC::Range> *)right_rotate(this,(node_type *)key_local);
        }
      }
      else {
        this_local = (Tree<NULLC::Range> *)right_rotate(this,(node_type *)key_local);
      }
    }
  }
  return (node_type *)this_local;
}

Assistant:

node_type* erase(node_type* node, const T& key)
	{
		if(node == NULL)
			return node;

		if(key < node->key)
		{
			node->left = erase(node->left, key);
		}else if(key > node->key){
			node->right = erase(node->right, key);
		}else{
			if((node->left == NULL) || (node->right == NULL))
			{
				node_type *temp = node->left ? node->left : node->right;

				if(temp == NULL)
				{
					temp = node;
					node = NULL;
				}else{
					*node = *temp;
				}

				pool.Deallocate(temp);

				if(temp == root)
					root = node;
			}else{
				node_type* temp = node->right->min_tree();

				node->key = temp->key;

				node->right = erase(node->right, temp->key);
			}
		}

		if(node == NULL)
			return node;

		node->height = detail::max(get_height(node->left), get_height(node->right)) + 1;

		int balance = get_balance(node);

		if(balance > 1 && get_balance(node->left) >= 0)
			return right_rotate(node);

		if(balance > 1 && get_balance(node->left) < 0)
		{
			node->left =  left_rotate(node->left);
			return right_rotate(node);
		}

		if(balance < -1 && get_balance(node->right) <= 0)
			return left_rotate(node);

		if(balance < -1 && get_balance(node->right) > 0)
		{
			node->right = right_rotate(node->right);
			return left_rotate(node);
		}

		return node;
	}